

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_mat.h
# Opt level: O3

bool __thiscall
dlib::
matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
::
aliases<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
          (matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
           *this,matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                 *item)

{
  bool bVar1;
  
  if ((*(long *)(item + 0x10) != 0 && *(long *)(item + 8) != 0) &&
     (*(long *)**(undefined8 **)this == *(long *)item)) {
    return true;
  }
  bVar1 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
          ::
          aliases<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                    (*(op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                       **)(this + 8),item);
  return bVar1;
}

Assistant:

bool aliases (
            const matrix_exp<matrix<T,num_rows,num_cols, mem_manager,layout> >& item
        ) const 
        { 
            if (item.size() == 0)
                return false;
            else
                return (ptr == &item(0,0)); 
        }